

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-lexer.cpp
# Opt level: O3

ostream * wasm::WATParser::operator<<(ostream *os,StringTok *tok)

{
  undefined8 in_RAX;
  ostream *poVar1;
  long lVar2;
  char *pcVar3;
  undefined8 uStack_28;
  
  if ((tok->str).
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged == true) {
    uStack_28._0_7_ = (undefined7)in_RAX;
    uStack_28 = CONCAT17(0x22,(undefined7)uStack_28);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)((long)&uStack_28 + 7),1)
    ;
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar1,(tok->str).
                               super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                               ._M_payload.
                               super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                               .
                               super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               ._M_payload._M_value._M_dataplus._M_p,
                        (tok->str).
                        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                        ._M_payload.
                        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                        .
                        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ._M_payload._M_value._M_string_length);
    pcVar3 = (char *)((long)&uStack_28 + 6);
    uStack_28._0_7_ = CONCAT16(0x22,(undefined6)uStack_28);
    lVar2 = 1;
  }
  else {
    pcVar3 = "(raw string)";
    lVar2 = 0xc;
    poVar1 = os;
    uStack_28 = in_RAX;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,pcVar3,lVar2);
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const StringTok& tok) {
  if (tok.str) {
    os << '"' << *tok.str << '"';
  } else {
    os << "(raw string)";
  }
  return os;
}